

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_num(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  undefined1 n_00 [16];
  undefined1 value [16];
  bool bVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  reference pcVar7;
  size_t sVar8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar9;
  undefined8 *in_RDI;
  char *data;
  int i;
  char *p;
  int digit_index;
  basic_string_view<char> s;
  type usize;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  const_iterator group;
  int n;
  int size;
  int num_digits;
  char sep;
  string groups;
  allocator<char> *in_stack_fffffffffffffc38;
  locale_ref in_stack_fffffffffffffc40;
  locale_ref in_stack_fffffffffffffc48;
  basic_string_view<char> *this_00;
  undefined8 in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  char *p_00;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
  *in_stack_fffffffffffffca0;
  anon_class_16_2_3f014a30 *in_stack_fffffffffffffcb8;
  size_t in_stack_fffffffffffffcc8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int iVar10;
  char *local_320;
  int local_30c;
  basic_string_view<char> local_308;
  type local_2f8;
  allocator<char> local_2f1;
  buffer<char> local_2f0 [16];
  format_decimal_result<char_*> local_d8;
  undefined8 local_c8;
  undefined8 local_c0;
  char local_b8 [48];
  undefined8 local_88;
  undefined8 local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 local_60;
  int local_54;
  undefined8 local_50;
  char local_41 [17];
  undefined8 local_30;
  string local_28 [40];
  
  local_30 = in_RDI[1];
  grouping<char>(in_stack_fffffffffffffc48);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x279d9a);
  if (bVar1) {
    on_dec(in_stack_fffffffffffffca0);
    local_41[1] = '\x01';
    local_41[2] = '\0';
    local_41[3] = '\0';
    local_41[4] = '\0';
  }
  else {
    local_50 = in_RDI[1];
    local_41[0] = thousands_sep<char>(in_stack_fffffffffffffc40);
    if (local_41[0] == '\0') {
      on_dec(in_stack_fffffffffffffca0);
      local_41[1] = '\x01';
      local_41[2] = '\0';
      local_41[3] = '\0';
      local_41[4] = '\0';
    }
    else {
      local_68 = in_RDI[4];
      local_60 = in_RDI[5];
      n_00._8_8_ = in_stack_fffffffffffffc48.locale_;
      n_00._0_8_ = in_stack_fffffffffffffc40.locale_;
      local_70 = count_digits((uint128_t)n_00);
      local_6c = local_70;
      local_54 = local_70;
      local_78._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        local_80 = std::__cxx11::string::cend();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc40.locale_,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc38);
        iVar10 = local_70;
        bVar1 = false;
        if (bVar2) {
          pcVar7 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78);
          bVar1 = false;
          if (*pcVar7 < iVar10) {
            pcVar7 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_78);
            bVar1 = false;
            if ('\0' < *pcVar7) {
              pcVar7 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_78);
              cVar4 = *pcVar7;
              cVar3 = max_value<char>();
              bVar1 = cVar4 != cVar3;
            }
          }
        }
        iVar10 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
        if (!bVar1) break;
        local_6c = local_6c + 1;
        pcVar7 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_78);
        local_70 = local_70 - *pcVar7;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_78);
      }
      local_88 = std::__cxx11::string::cend();
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc40.locale_,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc38);
      if (bVar1) {
        iVar5 = local_70 + -1;
        pcVar6 = (char *)std::__cxx11::string::back();
        local_6c = iVar5 / (int)*pcVar6 + local_6c;
      }
      local_c8 = in_RDI[4];
      local_c0 = in_RDI[5];
      value._8_8_ = in_stack_fffffffffffffc68;
      value._0_8_ = in_stack_fffffffffffffc60;
      local_d8 = format_decimal<char,unsigned__int128>
                           ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                            (unsigned___int128)value,iVar10);
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc40.locale_,in_stack_fffffffffffffc38);
      std::allocator<char>::~allocator(&local_2f1);
      local_6c = local_6c + *(int *)((long)in_RDI + 0x34);
      local_2f8 = to_unsigned<int>(local_6c);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc40.locale_,(size_t)in_stack_fffffffffffffc38);
      basic_string_view<char>::basic_string_view(&local_308,local_41,1);
      local_30c = 0;
      local_78._M_current = (char *)std::__cxx11::string::cbegin();
      pcVar6 = buffer<char>::data(local_2f0);
      local_320 = pcVar6 + (long)local_6c + -1;
      iVar10 = local_54;
      while (iVar10 = iVar10 + -1, 0 < iVar10) {
        pcVar6 = local_320 + -1;
        *local_320 = local_b8[iVar10];
        pcVar7 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_78);
        local_320 = pcVar6;
        if ('\0' < *pcVar7) {
          local_30c = local_30c + 1;
          iVar5 = local_30c;
          pcVar7 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78);
          if (iVar5 % (int)*pcVar7 == 0) {
            pcVar7 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_78);
            iVar5 = (int)*pcVar7;
            cVar4 = max_value<char>();
            if (iVar5 != cVar4) {
              in_stack_fffffffffffffcd0 =
                   __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffc48.locale_,
                               (difference_type)in_stack_fffffffffffffc40.locale_);
              in_stack_fffffffffffffcc8 = std::__cxx11::string::cend();
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffc40.locale_,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffc38);
              if (bVar1) {
                local_30c = 0;
                __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_78);
              }
              this_00 = &local_308;
              in_stack_fffffffffffffc48.locale_ = basic_string_view<char>::data(this_00);
              basic_string_view<char>::data(this_00);
              basic_string_view<char>::size(this_00);
              p_00 = pcVar6;
              sVar8 = basic_string_view<char>::size(this_00);
              make_checked<char>(p_00,sVar8);
              std::uninitialized_copy<char_const*,char*>
                        ((char *)this_00,(char *)in_stack_fffffffffffffc48.locale_,
                         (char *)in_stack_fffffffffffffc40.locale_);
              sVar8 = basic_string_view<char>::size(&local_308);
              local_320 = pcVar6 + -sVar8;
            }
          }
        }
      }
      *local_320 = local_b8[0];
      if (*(int *)((long)in_RDI + 0x34) != 0) {
        local_320[-1] = '-';
      }
      pcVar6 = buffer<char>::data(local_2f0);
      bVar9.container._4_4_ = iVar10;
      bVar9.container._0_4_ = in_stack_fffffffffffffcd8;
      bVar9 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>::on_num()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>
                        (bVar9,(basic_format_specs<char> *)in_stack_fffffffffffffcd0._M_current,
                         in_stack_fffffffffffffcc8,(size_t)pcVar6,in_stack_fffffffffffffcb8);
      *in_RDI = bVar9.container;
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)bVar9.container);
      local_41[1] = '\0';
      local_41[2] = '\0';
      local_41[3] = '\0';
      local_41[4] = '\0';
    }
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }